

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_avx2.c
# Opt level: O2

void av1_dist_wtd_convolve_y_avx2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int use_dist_wtd_comp_avg;
  long lVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  undefined1 (*pauVar8) [16];
  uint uVar9;
  long lVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  long lVar13;
  undefined1 (*pauVar14) [16];
  int iVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  uint8_t *puVar19;
  undefined1 (*pauVar20) [16];
  long lVar21;
  uint8_t *puVar22;
  uint8_t *puVar23;
  uint8_t *puVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  __m128i res_0;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined2 uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  __m256i data_ref_0_hi;
  __m256i data_ref_0_lo;
  __m256i wt;
  __m256i data_ref_0;
  __m256i src_ab [7];
  __m256i coeffs [4];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_500 [32];
  undefined1 local_4c0 [32];
  undefined1 local_340 [16];
  longlong local_330;
  longlong lStack_328;
  longlong local_320;
  longlong lStack_318;
  longlong local_310;
  longlong lStack_308;
  __m256i local_300;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  __m256i local_2a0;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_1e0 [32];
  __m256i local_1c0;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  __m256i local_e0;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar5 = 8 - conv_params->round_0;
  iVar15 = (1 << ((byte)conv_params->round_1 & 0x1f)) >> 1;
  iVar6 = conv_params->round_1 + conv_params->round_0;
  cVar4 = (char)iVar6;
  iVar17 = 1 << (0x16U - cVar4 & 0x1f);
  pauVar20 = (undefined1 (*) [16])conv_params->dst;
  uVar9 = 0xe - iVar6;
  lVar21 = (long)conv_params->dst_stride;
  uVar32 = (undefined2)conv_params->fwd_offset;
  auVar35._2_2_ = uVar32;
  auVar35._0_2_ = uVar32;
  auVar35._4_2_ = uVar32;
  auVar35._6_2_ = uVar32;
  auVar35._8_2_ = uVar32;
  auVar35._10_2_ = uVar32;
  auVar35._12_2_ = uVar32;
  auVar35._14_2_ = uVar32;
  auVar35._16_2_ = uVar32;
  auVar35._18_2_ = uVar32;
  auVar35._20_2_ = uVar32;
  auVar35._22_2_ = uVar32;
  auVar35._24_2_ = uVar32;
  auVar35._26_2_ = uVar32;
  auVar35._28_2_ = uVar32;
  auVar35._30_2_ = uVar32;
  uVar32 = (undefined2)conv_params->bck_offset;
  auVar39._2_2_ = uVar32;
  auVar39._0_2_ = uVar32;
  auVar39._4_2_ = uVar32;
  auVar39._6_2_ = uVar32;
  auVar39._8_2_ = uVar32;
  auVar39._10_2_ = uVar32;
  auVar39._12_2_ = uVar32;
  auVar39._14_2_ = uVar32;
  auVar39._16_2_ = uVar32;
  auVar39._18_2_ = uVar32;
  auVar39._20_2_ = uVar32;
  auVar39._22_2_ = uVar32;
  auVar39._24_2_ = uVar32;
  auVar39._26_2_ = uVar32;
  auVar39._28_2_ = uVar32;
  auVar39._30_2_ = uVar32;
  local_300 = (__m256i)vpunpcklwd_avx2(auVar35,auVar39);
  auVar34 = ZEXT416((uint)conv_params->round_1);
  iVar6 = conv_params->do_average;
  use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  local_4c0._2_2_ = (undefined2)((-1 << (0x15U - cVar4 & 0x1f)) - iVar17);
  local_4c0._0_2_ = local_4c0._2_2_;
  local_4c0._4_2_ = local_4c0._2_2_;
  local_4c0._6_2_ = local_4c0._2_2_;
  local_4c0._8_2_ = local_4c0._2_2_;
  local_4c0._10_2_ = local_4c0._2_2_;
  local_4c0._12_2_ = local_4c0._2_2_;
  local_4c0._14_2_ = local_4c0._2_2_;
  local_4c0._16_2_ = local_4c0._2_2_;
  local_4c0._18_2_ = local_4c0._2_2_;
  local_4c0._20_2_ = local_4c0._2_2_;
  local_4c0._22_2_ = local_4c0._2_2_;
  local_4c0._24_2_ = local_4c0._2_2_;
  local_4c0._26_2_ = local_4c0._2_2_;
  local_4c0._28_2_ = local_4c0._2_2_;
  local_4c0._30_2_ = local_4c0._2_2_;
  uVar32 = (undefined2)iVar17;
  local_540._2_2_ = (undefined2)((uint)(1 << ((byte)uVar9 & 0x1f)) >> 1);
  local_540._0_2_ = local_540._2_2_;
  local_540._4_2_ = local_540._2_2_;
  local_540._6_2_ = local_540._2_2_;
  local_540._8_2_ = local_540._2_2_;
  local_540._10_2_ = local_540._2_2_;
  local_540._12_2_ = local_540._2_2_;
  local_540._14_2_ = local_540._2_2_;
  local_540._16_2_ = local_540._2_2_;
  local_540._18_2_ = local_540._2_2_;
  local_540._20_2_ = local_540._2_2_;
  local_540._22_2_ = local_540._2_2_;
  local_540._24_2_ = local_540._2_2_;
  local_540._26_2_ = local_540._2_2_;
  local_540._28_2_ = local_540._2_2_;
  local_540._30_2_ = local_540._2_2_;
  prepare_coeffs_lowbd(filter_params_y,subpel_y_qn,&local_e0);
  auVar31 = vpor_avx(local_80._0_16_,local_e0._0_16_);
  if (auVar31._0_4_ == 0) {
    lVar7 = (long)src_stride;
    local_2c0._0_8_ = (long)src - lVar7;
    auVar35 = vpaddw_avx2(local_540,local_4c0);
    local_2e0._0_8_ = (long)w;
    puVar11 = src + lVar7 * 4;
    puVar12 = src + lVar7 * 5;
    lVar3 = (long)dst_stride0 * 2;
    lVar13 = 0;
    auVar41 = ZEXT3264(CONCAT428(iVar15,CONCAT424(iVar15,CONCAT420(iVar15,CONCAT416(iVar15,CONCAT412
                                                  (iVar15,CONCAT48(iVar15,CONCAT44(iVar15,iVar15))))
                                                  ))));
    auVar42 = ZEXT3264(CONCAT230(uVar32,CONCAT228(uVar32,CONCAT226(uVar32,CONCAT224(uVar32,CONCAT222
                                                  (uVar32,CONCAT220(uVar32,CONCAT218(uVar32,
                                                  CONCAT216(uVar32,CONCAT214(uVar32,CONCAT212(uVar32
                                                  ,CONCAT210(uVar32,CONCAT28(uVar32,CONCAT26(uVar32,
                                                  CONCAT24(uVar32,CONCAT22(uVar32,uVar32))))))))))))
                                                  ))));
    while( true ) {
      lVar16 = local_2e0._0_8_ - lVar13;
      if ((long)local_2e0._0_8_ <= lVar13) break;
      auVar31 = *(undefined1 (*) [16])(local_2c0._0_8_ + lVar13);
      auVar27._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar31;
      auVar27._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar31;
      pauVar14 = (undefined1 (*) [16])src;
      for (lVar18 = 0x20; lVar18 != 0xa0; lVar18 = lVar18 + 0x20) {
        auVar31 = *pauVar14;
        auVar28._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar27._0_16_;
        auVar28._16_16_ = ZEXT116(0) * auVar27._16_16_ + ZEXT116(1) * auVar31;
        auVar27._0_16_ = ZEXT116(0) * auVar28._0_16_ + ZEXT116(1) * auVar31;
        auVar27._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar28._0_16_;
        *(undefined1 (*) [32])((long)local_1c0 + lVar18) = auVar27;
        *(undefined1 (*) [32])(local_2c0 + lVar18) = auVar28;
        pauVar14 = (undefined1 (*) [16])(*pauVar14 + lVar7);
      }
      auVar28 = vpunpcklbw_avx2((undefined1  [32])local_2a0,local_280);
      auVar25 = vpunpcklbw_avx2(local_260,local_240);
      auVar39 = vpunpckhbw_avx2((undefined1  [32])local_2a0,local_280);
      auVar27 = vpunpckhbw_avx2(local_260,local_240);
      lVar18 = 0;
      puVar19 = dst0;
      puVar22 = puVar11;
      pauVar14 = pauVar20;
      puVar23 = puVar12;
      puVar24 = dst0 + dst_stride0;
      auVar43 = ZEXT3264(local_140);
      while( true ) {
        auVar31 = auVar39._0_16_;
        if (h <= lVar18) break;
        auVar28 = vpmaddubsw_avx2(auVar28,local_c0);
        auVar33 = vpmaddubsw_avx2(auVar25,local_a0);
        auVar28 = vpaddw_avx2(auVar28,auVar33);
        auVar37._8_2_ = 0x2000;
        auVar37._0_8_ = 0x2000200020002000;
        auVar37._10_2_ = 0x2000;
        auVar37._12_2_ = 0x2000;
        auVar37._14_2_ = 0x2000;
        auVar37._16_2_ = 0x2000;
        auVar37._18_2_ = 0x2000;
        auVar37._20_2_ = 0x2000;
        auVar37._22_2_ = 0x2000;
        auVar37._24_2_ = 0x2000;
        auVar37._26_2_ = 0x2000;
        auVar37._28_2_ = 0x2000;
        auVar37._30_2_ = 0x2000;
        auVar28 = vpaddw_avx2(auVar28,auVar37);
        auVar26 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar33 = vpunpcklwd_avx2(auVar28,auVar26);
        auVar33 = vpslld_avx2(auVar33,ZEXT416(uVar5));
        auVar38 = auVar41._0_32_;
        auVar33 = vpaddd_avx2(auVar33,auVar38);
        auVar33 = vpsrad_avx2(auVar33,auVar34);
        auVar1 = *(undefined1 (*) [16])(puVar22 + lVar13);
        auVar28 = vpunpckhwd_avx2(auVar28,auVar26);
        auVar28 = vpslld_avx2(auVar28,ZEXT416(uVar5));
        auVar2 = *(undefined1 (*) [16])(puVar23 + lVar13);
        auVar28 = vpaddd_avx2(auVar28,auVar38);
        auVar28 = vpsrad_avx2(auVar28,auVar34);
        auVar28 = vpackssdw_avx2(auVar33,auVar28);
        local_1c0 = (__m256i)vpaddw_avx2(auVar28,auVar42._0_32_);
        if (lVar16 < 0x10) {
          if (iVar6 == 0) {
            *pauVar14 = local_1c0._0_16_;
            *(undefined1 (*) [16])(*pauVar14 + lVar21 * 2) = local_1c0._16_16_;
          }
          else {
            auVar31 = *pauVar14;
            auVar39 = ZEXT1632(auVar31);
            local_2a0[2] = *(undefined8 *)(*pauVar14 + lVar21 * 2);
            local_2a0[3] = *(longlong *)((long)(*pauVar14 + lVar21 * 2) + 8);
            local_2a0[0] = auVar31._0_8_;
            local_2a0[1] = auVar31._8_8_;
            comp_avg(&local_2a0,&local_1c0,&local_300,use_dist_wtd_comp_avg);
            auVar39 = vpaddw_avx2(auVar39,auVar35);
            auVar39 = vpsraw_avx2(auVar39,ZEXT416(uVar9));
            auVar39 = vpackuswb_avx2(auVar39,auVar39);
            auVar31 = auVar39._16_16_;
            if (lVar16 < 5) {
              *(int *)(puVar19 + lVar13) = auVar39._0_4_;
              *(int *)(puVar24 + lVar13) = auVar39._16_4_;
            }
            else {
              *(long *)(puVar19 + lVar13) = auVar39._0_8_;
              *(long *)(puVar24 + lVar13) = auVar39._16_8_;
            }
            auVar41 = ZEXT3264(CONCAT428(iVar15,CONCAT424(iVar15,CONCAT420(iVar15,CONCAT416(iVar15,
                                                  CONCAT412(iVar15,CONCAT48(iVar15,CONCAT44(iVar15,
                                                  iVar15))))))));
            auVar42 = ZEXT3264(CONCAT230(uVar32,CONCAT228(uVar32,CONCAT226(uVar32,CONCAT224(uVar32,
                                                  CONCAT222(uVar32,CONCAT220(uVar32,CONCAT218(uVar32
                                                  ,CONCAT216(uVar32,CONCAT214(uVar32,CONCAT212(
                                                  uVar32,CONCAT210(uVar32,CONCAT28(uVar32,CONCAT26(
                                                  uVar32,CONCAT24(uVar32,CONCAT22(uVar32,uVar32)))))
                                                  )))))))))));
            auVar43 = ZEXT3264(auVar43._0_32_);
          }
        }
        else {
          auVar39 = vpmaddubsw_avx2(auVar39,local_c0);
          auVar28 = vpmaddubsw_avx2(auVar27,local_a0);
          auVar39 = vpaddw_avx2(auVar39,auVar28);
          auVar39 = vpaddw_avx2(auVar39,auVar37);
          auVar28 = vpunpcklwd_avx2(auVar39,auVar26);
          auVar28 = vpslld_avx2(auVar28,ZEXT416(uVar5));
          auVar28 = vpaddd_avx2(auVar28,auVar38);
          auVar28 = vpsrad_avx2(auVar28,auVar34);
          auVar39 = vpunpckhwd_avx2(auVar39,auVar26);
          auVar39 = vpslld_avx2(auVar39,ZEXT416(uVar5));
          auVar39 = vpaddd_avx2(auVar39,auVar38);
          auVar39 = vpsrad_avx2(auVar39,auVar34);
          auVar39 = vpackssdw_avx2(auVar28,auVar39);
          local_2a0 = (__m256i)vpaddw_avx2(auVar39,auVar42._0_32_);
          auVar31 = local_2a0._0_16_;
          if (iVar6 == 0) {
            *pauVar14 = local_1c0._0_16_;
            *(undefined1 (*) [16])(*pauVar14 + lVar21 * 2) = local_1c0._16_16_;
            pauVar14[1] = auVar31;
            *(undefined1 (*) [16])(pauVar14[1] + lVar21 * 2) = local_2a0._16_16_;
          }
          else {
            local_320 = *(longlong *)*pauVar14;
            lStack_318 = *(longlong *)(*pauVar14 + 8);
            local_310 = *(longlong *)(*pauVar14 + lVar21 * 2);
            lStack_308 = *(longlong *)((long)(*pauVar14 + lVar21 * 2) + 8);
            local_340 = pauVar14[1];
            auVar39 = ZEXT1632(local_340);
            local_330 = *(longlong *)(pauVar14[1] + lVar21 * 2);
            lStack_328 = *(longlong *)((long)(pauVar14[1] + lVar21 * 2) + 8);
            comp_avg((__m256i *)&local_320,&local_1c0,&local_300,use_dist_wtd_comp_avg);
            auVar33 = auVar39;
            comp_avg((__m256i *)local_340,&local_2a0,&local_300,use_dist_wtd_comp_avg);
            auVar43 = ZEXT3264(auVar43._0_32_);
            auVar42 = ZEXT3264(CONCAT230(uVar32,CONCAT228(uVar32,CONCAT226(uVar32,CONCAT224(uVar32,
                                                  CONCAT222(uVar32,CONCAT220(uVar32,CONCAT218(uVar32
                                                  ,CONCAT216(uVar32,CONCAT214(uVar32,CONCAT212(
                                                  uVar32,CONCAT210(uVar32,CONCAT28(uVar32,CONCAT26(
                                                  uVar32,CONCAT24(uVar32,CONCAT22(uVar32,uVar32)))))
                                                  )))))))))));
            auVar41 = ZEXT3264(CONCAT428(iVar15,CONCAT424(iVar15,CONCAT420(iVar15,CONCAT416(iVar15,
                                                  CONCAT412(iVar15,CONCAT48(iVar15,CONCAT44(iVar15,
                                                  iVar15))))))));
            auVar39 = vpaddw_avx2(auVar35,auVar39);
            auVar28 = vpsraw_avx2(auVar39,ZEXT416(uVar9));
            auVar39 = vpaddw_avx2(auVar35,auVar33);
            auVar39 = vpsraw_avx2(auVar39,ZEXT416(uVar9));
            auVar39 = vpackuswb_avx2(auVar28,auVar39);
            auVar31 = auVar39._0_16_;
            *(undefined1 (*) [16])(puVar19 + lVar13) = auVar31;
            *(undefined1 (*) [16])(puVar24 + lVar13) = auVar39._16_16_;
          }
        }
        auVar33._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar43._0_16_;
        auVar33._16_16_ = ZEXT116(0) * auVar43._16_16_ + ZEXT116(1) * auVar1;
        auVar44._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar2;
        auVar44._32_32_ = auVar43._32_32_;
        auVar44._16_16_ = ZEXT116(1) * auVar31;
        auVar38._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar1;
        auVar38._16_16_ = ZEXT116(1) * auVar2;
        auVar37 = vpunpcklbw_avx2(auVar33,auVar38);
        auVar33 = vpunpckhbw_avx2(auVar33,auVar38);
        lVar18 = lVar18 + 2;
        puVar22 = puVar22 + lVar7 * 2;
        puVar23 = puVar23 + lVar7 * 2;
        puVar24 = puVar24 + lVar3;
        puVar19 = puVar19 + lVar3;
        pauVar14 = (undefined1 (*) [16])(*pauVar14 + lVar21 * 4);
        auVar43 = auVar44;
        auVar39 = auVar27;
        auVar28 = auVar25;
        auVar25 = auVar37;
        auVar27 = auVar33;
      }
      lVar13 = lVar13 + 0x10;
      src = (uint8_t *)((long)src + 0x10);
      pauVar20 = pauVar20 + 2;
    }
  }
  else {
    lVar7 = (long)(int)(((filter_params_y->taps >> 1) - 1) * src_stride);
    lVar13 = (long)src_stride;
    local_2e0 = vpaddw_avx2(local_540,local_4c0);
    pauVar14 = (undefined1 (*) [16])(src + (lVar13 - lVar7));
    lVar3 = (long)dst_stride0 * 2;
    auVar41 = ZEXT3264(CONCAT428(iVar15,CONCAT424(iVar15,CONCAT420(iVar15,CONCAT416(iVar15,CONCAT412
                                                  (iVar15,CONCAT48(iVar15,CONCAT44(iVar15,iVar15))))
                                                  ))));
    auVar42 = ZEXT3264(CONCAT230(uVar32,CONCAT228(uVar32,CONCAT226(uVar32,CONCAT224(uVar32,CONCAT222
                                                  (uVar32,CONCAT220(uVar32,CONCAT218(uVar32,
                                                  CONCAT216(uVar32,CONCAT214(uVar32,CONCAT212(uVar32
                                                  ,CONCAT210(uVar32,CONCAT28(uVar32,CONCAT26(uVar32,
                                                  CONCAT24(uVar32,CONCAT22(uVar32,uVar32))))))))))))
                                                  ))));
    for (lVar16 = 0; lVar18 = w - lVar16, lVar16 < w; lVar16 = lVar16 + 0x10) {
      auVar31 = *(undefined1 (*) [16])(src + (lVar16 - lVar7));
      auVar25._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar31;
      auVar25._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar31;
      pauVar8 = pauVar14;
      for (lVar10 = 0x20; lVar10 != 0xe0; lVar10 = lVar10 + 0x20) {
        auVar31 = *pauVar8;
        auVar26._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar25._0_16_;
        auVar26._16_16_ = ZEXT116(0) * auVar25._16_16_ + ZEXT116(1) * auVar31;
        auVar25._0_16_ = ZEXT116(0) * auVar26._0_16_ + ZEXT116(1) * auVar31;
        auVar25._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26._0_16_;
        *(undefined1 (*) [32])((long)local_2a0 + lVar10) = auVar25;
        *(undefined1 (*) [32])(local_1e0 + lVar10) = auVar26;
        pauVar8 = (undefined1 (*) [16])(*pauVar8 + lVar13);
      }
      auVar27 = vpunpcklbw_avx2((undefined1  [32])local_1c0,local_1a0);
      auVar28 = vpunpcklbw_avx2(local_180,local_160);
      local_500 = vpunpcklbw_avx2(local_140,local_120);
      auVar35 = vpunpckhbw_avx2((undefined1  [32])local_1c0,local_1a0);
      local_560 = vpunpckhbw_avx2(local_180,local_160);
      auVar39 = vpunpckhbw_avx2(local_140,local_120);
      puVar11 = dst0;
      puVar12 = dst0 + dst_stride0;
      puVar19 = src + (lVar13 * 8 - lVar7);
      pauVar8 = pauVar20;
      puVar22 = src + (lVar13 * 7 - lVar7);
      auVar30 = local_1e0;
      for (lVar10 = 0; lVar10 < h; lVar10 = lVar10 + 2) {
        auVar31 = *(undefined1 (*) [16])(puVar22 + lVar16);
        auVar29._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar30._0_16_;
        auVar29._16_16_ = ZEXT116(0) * auVar30._16_16_ + ZEXT116(1) * auVar31;
        auVar1 = *(undefined1 (*) [16])(puVar19 + lVar16);
        auVar40._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar31;
        auVar40._16_16_ = ZEXT116(1) * auVar1;
        auVar37 = vpunpcklbw_avx2(auVar29,auVar40);
        auVar27 = vpmaddubsw_avx2(auVar27,(undefined1  [32])local_e0);
        auVar25 = vpmaddubsw_avx2(auVar28,local_c0);
        auVar27 = vpaddw_avx2(auVar27,auVar25);
        auVar25 = vpmaddubsw_avx2(local_500,local_a0);
        auVar27 = vpaddw_avx2(auVar27,auVar25);
        auVar25 = vpmaddubsw_avx2(auVar37,local_80);
        auVar36._8_2_ = 0x2000;
        auVar36._0_8_ = 0x2000200020002000;
        auVar36._10_2_ = 0x2000;
        auVar36._12_2_ = 0x2000;
        auVar36._14_2_ = 0x2000;
        auVar36._16_2_ = 0x2000;
        auVar36._18_2_ = 0x2000;
        auVar36._20_2_ = 0x2000;
        auVar36._22_2_ = 0x2000;
        auVar36._24_2_ = 0x2000;
        auVar36._26_2_ = 0x2000;
        auVar36._28_2_ = 0x2000;
        auVar36._30_2_ = 0x2000;
        auVar27 = vpaddw_avx2(auVar27,auVar36);
        auVar27 = vpaddw_avx2(auVar27,auVar25);
        auVar26 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        auVar25 = vpunpcklwd_avx2(auVar27,auVar26);
        auVar25 = vpslld_avx2(auVar25,ZEXT416(uVar5));
        auVar38 = auVar41._0_32_;
        auVar25 = vpaddd_avx2(auVar38,auVar25);
        auVar25 = vpsrad_avx2(auVar25,auVar34);
        auVar33 = vpunpckhbw_avx2(auVar29,auVar40);
        auVar27 = vpunpckhwd_avx2(auVar27,auVar26);
        auVar27 = vpslld_avx2(auVar27,ZEXT416(uVar5));
        auVar27 = vpaddd_avx2(auVar38,auVar27);
        auVar27 = vpsrad_avx2(auVar27,auVar34);
        auVar27 = vpackssdw_avx2(auVar25,auVar27);
        local_1c0 = (__m256i)vpaddw_avx2(auVar42._0_32_,auVar27);
        auVar31 = ZEXT416(uVar9);
        if (lVar18 < 0x10) {
          if (iVar6 == 0) {
            *pauVar8 = local_1c0._0_16_;
            *(undefined1 (*) [16])(*pauVar8 + lVar21 * 2) = local_1c0._16_16_;
          }
          else {
            auVar2 = *pauVar8;
            auVar35 = ZEXT1632(auVar2);
            local_2a0[2] = *(undefined8 *)(*pauVar8 + lVar21 * 2);
            local_2a0[3] = *(longlong *)((long)(*pauVar8 + lVar21 * 2) + 8);
            local_2a0[0] = auVar2._0_8_;
            local_2a0[1] = auVar2._8_8_;
            comp_avg(&local_2a0,&local_1c0,&local_300,use_dist_wtd_comp_avg);
            auVar35 = vpaddw_avx2(auVar35,local_2e0);
            auVar35 = vpsraw_avx2(auVar35,auVar31);
            auVar35 = vpackuswb_avx2(auVar35,auVar35);
            if (lVar18 < 5) {
              *(int *)(puVar11 + lVar16) = auVar35._0_4_;
              *(int *)(puVar12 + lVar16) = auVar35._16_4_;
            }
            else {
              *(long *)(puVar11 + lVar16) = auVar35._0_8_;
              *(long *)(puVar12 + lVar16) = auVar35._16_8_;
            }
            auVar41 = ZEXT3264(CONCAT428(iVar15,CONCAT424(iVar15,CONCAT420(iVar15,CONCAT416(iVar15,
                                                  CONCAT412(iVar15,CONCAT48(iVar15,CONCAT44(iVar15,
                                                  iVar15))))))));
            auVar42 = ZEXT3264(CONCAT230(uVar32,CONCAT228(uVar32,CONCAT226(uVar32,CONCAT224(uVar32,
                                                  CONCAT222(uVar32,CONCAT220(uVar32,CONCAT218(uVar32
                                                  ,CONCAT216(uVar32,CONCAT214(uVar32,CONCAT212(
                                                  uVar32,CONCAT210(uVar32,CONCAT28(uVar32,CONCAT26(
                                                  uVar32,CONCAT24(uVar32,CONCAT22(uVar32,uVar32)))))
                                                  )))))))))));
          }
        }
        else {
          auVar35 = vpmaddubsw_avx2(auVar35,(undefined1  [32])local_e0);
          auVar27 = vpmaddubsw_avx2(local_560,local_c0);
          auVar35 = vpaddw_avx2(auVar35,auVar27);
          auVar27 = vpmaddubsw_avx2(auVar39,local_a0);
          auVar35 = vpaddw_avx2(auVar35,auVar27);
          auVar27 = vpmaddubsw_avx2(auVar33,local_80);
          auVar35 = vpaddw_avx2(auVar35,auVar36);
          auVar35 = vpaddw_avx2(auVar35,auVar27);
          auVar27 = vpunpcklwd_avx2(auVar35,auVar26);
          auVar27 = vpslld_avx2(auVar27,ZEXT416(uVar5));
          auVar27 = vpaddd_avx2(auVar38,auVar27);
          auVar27 = vpsrad_avx2(auVar27,auVar34);
          auVar35 = vpunpckhwd_avx2(auVar35,auVar26);
          auVar35 = vpslld_avx2(auVar35,ZEXT416(uVar5));
          auVar35 = vpaddd_avx2(auVar38,auVar35);
          auVar35 = vpsrad_avx2(auVar35,auVar34);
          auVar35 = vpackssdw_avx2(auVar27,auVar35);
          local_2a0 = (__m256i)vpaddw_avx2(auVar42._0_32_,auVar35);
          if (iVar6 == 0) {
            *pauVar8 = local_1c0._0_16_;
            *(undefined1 (*) [16])(*pauVar8 + lVar21 * 2) = local_1c0._16_16_;
            pauVar8[1] = local_2a0._0_16_;
            *(undefined1 (*) [16])(pauVar8[1] + lVar21 * 2) = local_2a0._16_16_;
          }
          else {
            local_320 = *(longlong *)*pauVar8;
            lStack_318 = *(longlong *)(*pauVar8 + 8);
            local_310 = *(longlong *)(*pauVar8 + lVar21 * 2);
            lStack_308 = *(longlong *)((long)(*pauVar8 + lVar21 * 2) + 8);
            local_340 = pauVar8[1];
            auVar25 = ZEXT1632(local_340);
            local_330 = *(longlong *)(pauVar8[1] + lVar21 * 2);
            lStack_328 = *(longlong *)((long)(pauVar8[1] + lVar21 * 2) + 8);
            comp_avg((__m256i *)&local_320,&local_1c0,&local_300,use_dist_wtd_comp_avg);
            local_2c0 = auVar25;
            comp_avg((__m256i *)local_340,&local_2a0,&local_300,use_dist_wtd_comp_avg);
            auVar42 = ZEXT3264(CONCAT230(uVar32,CONCAT228(uVar32,CONCAT226(uVar32,CONCAT224(uVar32,
                                                  CONCAT222(uVar32,CONCAT220(uVar32,CONCAT218(uVar32
                                                  ,CONCAT216(uVar32,CONCAT214(uVar32,CONCAT212(
                                                  uVar32,CONCAT210(uVar32,CONCAT28(uVar32,CONCAT26(
                                                  uVar32,CONCAT24(uVar32,CONCAT22(uVar32,uVar32)))))
                                                  )))))))))));
            auVar41 = ZEXT3264(CONCAT428(iVar15,CONCAT424(iVar15,CONCAT420(iVar15,CONCAT416(iVar15,
                                                  CONCAT412(iVar15,CONCAT48(iVar15,CONCAT44(iVar15,
                                                  iVar15))))))));
            auVar35 = vpaddw_avx2(local_2e0,local_2c0);
            auVar27 = vpsraw_avx2(auVar35,auVar31);
            auVar35 = vpaddw_avx2(local_2e0,auVar25);
            auVar35 = vpsraw_avx2(auVar35,auVar31);
            auVar35 = vpackuswb_avx2(auVar27,auVar35);
            *(undefined1 (*) [16])(puVar11 + lVar16) = auVar35._0_16_;
            *(undefined1 (*) [16])(puVar12 + lVar16) = auVar35._16_16_;
          }
        }
        auVar30._0_16_ = ZEXT116(0) * local_500._0_16_ + ZEXT116(1) * auVar1;
        auVar30._16_16_ = ZEXT116(1) * local_500._0_16_;
        puVar22 = puVar22 + lVar13 * 2;
        puVar19 = puVar19 + lVar13 * 2;
        puVar12 = puVar12 + lVar3;
        puVar11 = puVar11 + lVar3;
        pauVar8 = (undefined1 (*) [16])(*pauVar8 + lVar21 * 4);
        auVar35 = local_560;
        auVar27 = auVar28;
        auVar28 = local_500;
        local_560 = auVar39;
        local_500 = auVar37;
        auVar39 = auVar33;
      }
      pauVar14 = pauVar14 + 1;
      pauVar20 = pauVar20 + 2;
    }
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_y_avx2(const uint8_t *src, int src_stride,
                                  uint8_t *dst0, int dst_stride0, int w, int h,
                                  const InterpFilterParams *filter_params_y,
                                  const int subpel_y_qn,
                                  ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int bd = 8;
  int i, j, is_vert_4tap = 0;
  // +1 to compensate for dividing the filter coeffs by 2
  const int left_shift = FILTER_BITS - conv_params->round_0 + 1;
  const __m256i round_const =
      _mm256_set1_epi32((1 << conv_params->round_1) >> 1);
  const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_1);
  const __m256i wt = unpack_weights_avx2(conv_params);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi16(offset);
  const int offset_1 = (1 << (bd + FILTER_BITS - 2));
  const __m256i offset_const_1 = _mm256_set1_epi16(offset_1);
  const __m256i offset_const_2 = _mm256_set1_epi16((1 << offset_0));
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi16((1 << rounding_shift) >> 1);
  const __m256i zero = _mm256_setzero_si256();
  __m256i coeffs[4], s[8];

  assert((FILTER_BITS - conv_params->round_0) >= 0);

  prepare_coeffs_lowbd(filter_params_y, subpel_y_qn, coeffs);

  // Condition for checking valid vert_filt taps
  if (!(_mm256_extract_epi32(_mm256_or_si256(coeffs[0], coeffs[3]), 0)))
    is_vert_4tap = 1;

  if (is_vert_4tap) {
    const int fo_vert = 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride;
    for (j = 0; j < w; j += 16) {
      const uint8_t *data = &src_ptr[j];
      __m256i src4;
      // Load lines a and b. Line a to lower 128, line b to upper 128
      {
        __m256i src_ab[4];
        __m256i src_a[5];
        src_a[0] = _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
        for (int kk = 0; kk < 4; ++kk) {
          data += src_stride;
          src_a[kk + 1] =
              _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
          src_ab[kk] =
              _mm256_permute2x128_si256(src_a[kk], src_a[kk + 1], 0x20);
        }
        src4 = src_a[4];
        s[0] = _mm256_unpacklo_epi8(src_ab[0], src_ab[1]);
        s[1] = _mm256_unpacklo_epi8(src_ab[2], src_ab[3]);

        s[3] = _mm256_unpackhi_epi8(src_ab[0], src_ab[1]);
        s[4] = _mm256_unpackhi_epi8(src_ab[2], src_ab[3]);
      }

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[(i + 5) * src_stride + j];
        const __m256i src5 =
            _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
        const __m256i src_45a = _mm256_permute2x128_si256(src4, src5, 0x20);

        src4 = _mm256_castsi128_si256(
            _mm_loadu_si128((__m128i *)(data + src_stride)));
        const __m256i src_56a = _mm256_permute2x128_si256(src5, src4, 0x20);

        s[2] = _mm256_unpacklo_epi8(src_45a, src_56a);
        s[5] = _mm256_unpackhi_epi8(src_45a, src_56a);

        __m256i res_lo = convolve_lowbd_4tap(s, coeffs + 1);

        res_lo = _mm256_add_epi16(res_lo, offset_const_1);

        const __m256i res_lo_0_32b = _mm256_unpacklo_epi16(res_lo, zero);
        const __m256i res_lo_0_shift =
            _mm256_slli_epi32(res_lo_0_32b, left_shift);
        const __m256i res_lo_0_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_lo_0_shift, round_const), round_shift);

        const __m256i res_lo_1_32b = _mm256_unpackhi_epi16(res_lo, zero);
        const __m256i res_lo_1_shift =
            _mm256_slli_epi32(res_lo_1_32b, left_shift);
        const __m256i res_lo_1_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_lo_1_shift, round_const), round_shift);

        const __m256i res_lo_round =
            _mm256_packs_epi32(res_lo_0_round, res_lo_1_round);

        const __m256i res_lo_unsigned =
            _mm256_add_epi16(res_lo_round, offset_const_2);

        if (w - j < 16) {
          if (do_average) {
            const __m256i data_ref_0 =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);
            const __m256i comp_avg_res = comp_avg(&data_ref_0, &res_lo_unsigned,
                                                  &wt, use_dist_wtd_comp_avg);

            const __m256i round_result = convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result, round_result);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            if (w - j > 4) {
              _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
              _mm_storel_epi64(
                  (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])),
                  res_1);
            } else {
              *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_0);
              *(int *)(&dst0[i * dst_stride0 + j + dst_stride0]) =
                  _mm_cvtsi128_si32(res_1);
            }
          } else {
            const __m128i res_0 = _mm256_castsi256_si128(res_lo_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

            const __m128i res_1 = _mm256_extracti128_si256(res_lo_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        } else {
          __m256i res_hi = convolve_lowbd_4tap(s + 3, coeffs + 1);

          res_hi = _mm256_add_epi16(res_hi, offset_const_1);

          const __m256i res_hi_0_32b = _mm256_unpacklo_epi16(res_hi, zero);
          const __m256i res_hi_0_shift =
              _mm256_slli_epi32(res_hi_0_32b, left_shift);
          const __m256i res_hi_0_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_hi_0_shift, round_const), round_shift);

          const __m256i res_hi_1_32b = _mm256_unpackhi_epi16(res_hi, zero);
          const __m256i res_hi_1_shift =
              _mm256_slli_epi32(res_hi_1_32b, left_shift);
          const __m256i res_hi_1_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_hi_1_shift, round_const), round_shift);

          const __m256i res_hi_round =
              _mm256_packs_epi32(res_hi_0_round, res_hi_1_round);

          const __m256i res_hi_unsigned =
              _mm256_add_epi16(res_hi_round, offset_const_2);

          if (do_average) {
            const __m256i data_ref_0_lo =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);

            const __m256i data_ref_0_hi =
                load_line2_avx2(&dst[i * dst_stride + j + 8],
                                &dst[i * dst_stride + j + 8 + dst_stride]);

            const __m256i comp_avg_res_lo = comp_avg(
                &data_ref_0_lo, &res_lo_unsigned, &wt, use_dist_wtd_comp_avg);

            const __m256i comp_avg_res_hi = comp_avg(
                &data_ref_0_hi, &res_hi_unsigned, &wt, use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                convolve_rounding(&comp_avg_res_lo, &offset_const,
                                  &rounding_const, rounding_shift);

            const __m256i round_result_hi =
                convolve_rounding(&comp_avg_res_hi, &offset_const,
                                  &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result_lo, round_result_hi);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])), res_1);

          } else {
            const __m128i res_lo_0 = _mm256_castsi256_si128(res_lo_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_lo_0);

            const __m128i res_lo_1 =
                _mm256_extracti128_si256(res_lo_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_lo_1);

            const __m128i res_hi_0 = _mm256_castsi256_si128(res_hi_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + 8]),
                            res_hi_0);

            const __m128i res_hi_1 =
                _mm256_extracti128_si256(res_hi_unsigned, 1);
            _mm_store_si128(
                (__m128i *)(&dst[i * dst_stride + j + 8 + dst_stride]),
                res_hi_1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];

        s[3] = s[4];
        s[4] = s[5];
      }
    }
  } else {
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride;
    for (j = 0; j < w; j += 16) {
      const uint8_t *data = &src_ptr[j];
      __m256i src6;
      // Load lines a and b. Line a to lower 128, line b to upper 128
      {
        __m256i src_ab[7];
        __m256i src_a[7];
        src_a[0] = _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
        for (int kk = 0; kk < 6; ++kk) {
          data += src_stride;
          src_a[kk + 1] =
              _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
          src_ab[kk] =
              _mm256_permute2x128_si256(src_a[kk], src_a[kk + 1], 0x20);
        }
        src6 = src_a[6];
        s[0] = _mm256_unpacklo_epi8(src_ab[0], src_ab[1]);
        s[1] = _mm256_unpacklo_epi8(src_ab[2], src_ab[3]);
        s[2] = _mm256_unpacklo_epi8(src_ab[4], src_ab[5]);
        s[4] = _mm256_unpackhi_epi8(src_ab[0], src_ab[1]);
        s[5] = _mm256_unpackhi_epi8(src_ab[2], src_ab[3]);
        s[6] = _mm256_unpackhi_epi8(src_ab[4], src_ab[5]);
      }

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[(i + 7) * src_stride + j];
        const __m256i src7 =
            _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)data));
        const __m256i src_67a = _mm256_permute2x128_si256(src6, src7, 0x20);

        src6 = _mm256_castsi128_si256(
            _mm_loadu_si128((__m128i *)(data + src_stride)));
        const __m256i src_78a = _mm256_permute2x128_si256(src7, src6, 0x20);

        s[3] = _mm256_unpacklo_epi8(src_67a, src_78a);
        s[7] = _mm256_unpackhi_epi8(src_67a, src_78a);

        __m256i res_lo = convolve_lowbd(s, coeffs);

        res_lo = _mm256_add_epi16(res_lo, offset_const_1);

        const __m256i res_lo_0_32b = _mm256_unpacklo_epi16(res_lo, zero);
        const __m256i res_lo_0_shift =
            _mm256_slli_epi32(res_lo_0_32b, left_shift);
        const __m256i res_lo_0_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_lo_0_shift, round_const), round_shift);

        const __m256i res_lo_1_32b = _mm256_unpackhi_epi16(res_lo, zero);
        const __m256i res_lo_1_shift =
            _mm256_slli_epi32(res_lo_1_32b, left_shift);
        const __m256i res_lo_1_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_lo_1_shift, round_const), round_shift);

        const __m256i res_lo_round =
            _mm256_packs_epi32(res_lo_0_round, res_lo_1_round);

        const __m256i res_lo_unsigned =
            _mm256_add_epi16(res_lo_round, offset_const_2);

        if (w - j < 16) {
          if (do_average) {
            const __m256i data_ref_0 =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);
            const __m256i comp_avg_res = comp_avg(&data_ref_0, &res_lo_unsigned,
                                                  &wt, use_dist_wtd_comp_avg);

            const __m256i round_result = convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result, round_result);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            if (w - j > 4) {
              _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
              _mm_storel_epi64(
                  (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])),
                  res_1);
            } else {
              *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_0);
              *(int *)(&dst0[i * dst_stride0 + j + dst_stride0]) =
                  _mm_cvtsi128_si32(res_1);
            }
          } else {
            const __m128i res_0 = _mm256_castsi256_si128(res_lo_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

            const __m128i res_1 = _mm256_extracti128_si256(res_lo_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        } else {
          __m256i res_hi = convolve_lowbd(s + 4, coeffs);

          res_hi = _mm256_add_epi16(res_hi, offset_const_1);

          const __m256i res_hi_0_32b = _mm256_unpacklo_epi16(res_hi, zero);
          const __m256i res_hi_0_shift =
              _mm256_slli_epi32(res_hi_0_32b, left_shift);
          const __m256i res_hi_0_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_hi_0_shift, round_const), round_shift);

          const __m256i res_hi_1_32b = _mm256_unpackhi_epi16(res_hi, zero);
          const __m256i res_hi_1_shift =
              _mm256_slli_epi32(res_hi_1_32b, left_shift);
          const __m256i res_hi_1_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_hi_1_shift, round_const), round_shift);

          const __m256i res_hi_round =
              _mm256_packs_epi32(res_hi_0_round, res_hi_1_round);

          const __m256i res_hi_unsigned =
              _mm256_add_epi16(res_hi_round, offset_const_2);

          if (do_average) {
            const __m256i data_ref_0_lo =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);

            const __m256i data_ref_0_hi =
                load_line2_avx2(&dst[i * dst_stride + j + 8],
                                &dst[i * dst_stride + j + 8 + dst_stride]);

            const __m256i comp_avg_res_lo = comp_avg(
                &data_ref_0_lo, &res_lo_unsigned, &wt, use_dist_wtd_comp_avg);

            const __m256i comp_avg_res_hi = comp_avg(
                &data_ref_0_hi, &res_hi_unsigned, &wt, use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                convolve_rounding(&comp_avg_res_lo, &offset_const,
                                  &rounding_const, rounding_shift);

            const __m256i round_result_hi =
                convolve_rounding(&comp_avg_res_hi, &offset_const,
                                  &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result_lo, round_result_hi);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])), res_1);

          } else {
            const __m128i res_lo_0 = _mm256_castsi256_si128(res_lo_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_lo_0);

            const __m128i res_lo_1 =
                _mm256_extracti128_si256(res_lo_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_lo_1);

            const __m128i res_hi_0 = _mm256_castsi256_si128(res_hi_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + 8]),
                            res_hi_0);

            const __m128i res_hi_1 =
                _mm256_extracti128_si256(res_hi_unsigned, 1);
            _mm_store_si128(
                (__m128i *)(&dst[i * dst_stride + j + 8 + dst_stride]),
                res_hi_1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}